

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O3

void __thiscall
InterpreterTestSuite_IESV_TwoImportExportClausesMustFail_Test::TestBody
          (InterpreterTestSuite_IESV_TwoImportExportClausesMustFail_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  size_type sVar3;
  undefined8 *puVar4;
  Registry *this_00;
  bool bVar5;
  char *pcVar6;
  Status local_46a;
  Status local_469;
  string local_468;
  string local_448;
  string local_428;
  undefined1 local_408 [8];
  _Alloc_hider local_400;
  char local_3f8 [8];
  char local_3f0 [16];
  _Alloc_hider local_3e0;
  char local_3d0 [16];
  internal local_3c0 [8];
  undefined8 *local_3b8;
  string local_3b0;
  State local_390;
  State local_38c;
  ByteArray local_388;
  ByteArray local_368;
  char *local_350;
  string local_348;
  string local_328;
  string local_308;
  UnixTime local_2e8;
  UnixTime local_2e0;
  Value value;
  TestContext ctx;
  
  InterpreterTestSuite::TestContext::TestContext(&ctx);
  InterpreterTestSuite::InitContext(&this->super_InterpreterTestSuite,&ctx);
  this_00 = ctx.mRegistry;
  local_408 = (undefined1  [8])local_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"127.0.0.1","");
  local_368.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_368.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_368.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"1.1","");
  ot::commissioner::BorderAgent::State::State(&local_38c,0,0,0,0,0);
  local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_468,"net1","");
  local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,"");
  local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"");
  local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"");
  local_388.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_388.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_388.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"domain1","");
  local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
  pcVar6 = "";
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"","");
  ot::commissioner::UnixTime::UnixTime(&local_2e0,0);
  ot::commissioner::BorderAgent::BorderAgent
            ((BorderAgent *)&value,(string *)local_408,0x4e21,&local_368,&local_448,local_38c,
             &local_468,1,&local_428,&local_3b0,(Timestamp)0x0,0,&local_308,&local_388,&local_328,
             '\0',0,&local_348,local_2e0,0x103f);
  local_469 = ot::commissioner::persistent_storage::Registry::Add(this_00,(BorderAgent *)&value);
  local_46a = kSuccess;
  testing::internal::
  CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
            (local_3c0,
             "ctx.mRegistry->Add(BorderAgent{\"127.0.0.1\", 20001, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net1\", 1, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"domain1\", 0, 0, \"\", 0, 0x1F | BorderAgent::kDomainNameBit | BorderAgent::kExtendedPanIdBit})"
             ,"RegistryStatus::kSuccess",&local_469,&local_46a);
  ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != &local_348.field_2) {
    operator_delete(local_348._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != &local_328.field_2) {
    operator_delete(local_328._M_dataplus._M_p);
  }
  if (local_388.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_388.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
    operator_delete(local_3b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_428._M_dataplus._M_p != &local_428.field_2) {
    operator_delete(local_428._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468._M_dataplus._M_p != &local_468.field_2) {
    operator_delete(local_468._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != &local_448.field_2) {
    operator_delete(local_448._M_dataplus._M_p);
  }
  if (local_368.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_368.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_408 != (undefined1  [8])local_3f8) {
    operator_delete((void *)local_408);
  }
  puVar4 = local_3b8;
  if (local_3c0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&value);
    if (local_3b8 != (undefined8 *)0x0) {
      pcVar6 = (char *)*local_3b8;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_408,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x2e9,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_408,(Message *)&value);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_408);
    if ((long *)CONCAT44(value.mError._4_4_,value.mError.mCode) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(value.mError._4_4_,value.mError.mCode) + 8))();
    }
    if (local_3b8 == (undefined8 *)0x0) goto LAB_00157bc9;
    if ((undefined8 *)*local_3b8 != local_3b8 + 2) {
      operator_delete((undefined8 *)*local_3b8);
    }
  }
  else {
    if (local_3b8 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_3b8 != local_3b8 + 2) {
        operator_delete((undefined8 *)*local_3b8);
      }
      operator_delete(puVar4);
    }
    local_408 = (undefined1  [8])local_3f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"127.0.0.2","");
    local_368.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_368.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_368.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"1.1","");
    ot::commissioner::BorderAgent::State::State(&local_390,0,0,0,0,0);
    local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_468,"net2","");
    local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,"");
    local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"");
    local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"");
    local_388.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_388.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_388.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"domain2","");
    local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
    local_350 = "";
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_348);
    ot::commissioner::UnixTime::UnixTime(&local_2e8,0);
    pcVar6 = (char *)(ulong)(uint)local_390;
    ot::commissioner::BorderAgent::BorderAgent
              ((BorderAgent *)&value,(string *)local_408,0x4e21,&local_368,&local_448,local_390,
               &local_468,2,&local_428,&local_3b0,(Timestamp)0x0,0,&local_308,&local_388,&local_328,
               '\0',0,&local_348,local_2e8,0x103f);
    local_469 = ot::commissioner::persistent_storage::Registry::Add
                          (ctx.mRegistry,(BorderAgent *)&value);
    local_46a = kSuccess;
    testing::internal::
    CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
              (local_3c0,
               "ctx.mRegistry->Add(BorderAgent{\"127.0.0.2\", 20001, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net2\", 2, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"domain2\", 0, 0, \"\", 0, 0x1F | BorderAgent::kDomainNameBit | BorderAgent::kExtendedPanIdBit})"
               ,"RegistryStatus::kSuccess",&local_469,&local_46a);
    ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&value);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_dataplus._M_p != &local_348.field_2) {
      operator_delete(local_348._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._M_dataplus._M_p != &local_328.field_2) {
      operator_delete(local_328._M_dataplus._M_p);
    }
    if (local_388.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_388.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._M_dataplus._M_p != &local_308.field_2) {
      operator_delete(local_308._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
      operator_delete(local_3b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_428._M_dataplus._M_p != &local_428.field_2) {
      operator_delete(local_428._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_468._M_dataplus._M_p != &local_468.field_2) {
      operator_delete(local_468._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_448._M_dataplus._M_p != &local_448.field_2) {
      operator_delete(local_448._M_dataplus._M_p);
    }
    if (local_368.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_368.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_408 != (undefined1  [8])local_3f8) {
      operator_delete((void *)local_408);
    }
    if (local_3c0[0] != (internal)0x0) {
      if (local_3b8 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_3b8 != local_3b8 + 2) {
          operator_delete((undefined8 *)*local_3b8);
        }
        operator_delete(local_3b8);
      }
      local_468.field_2._M_allocated_capacity = 0;
      local_468._M_dataplus._M_p = (pointer)0x0;
      local_468._M_string_length = 0;
      paVar1 = &value.mError.mMessage.field_2;
      value.mError.mCode = kNone;
      value.mError.mMessage._M_string_length = 0;
      value.mError.mMessage.field_2._M_local_buf[0] = '\0';
      paVar2 = &value.mData.field_2;
      value.mData._M_string_length = 0;
      value.mData.field_2._M_local_buf[0] = '\0';
      local_408 = (undefined1  [8])local_3f8;
      value.mError.mMessage._M_dataplus._M_p = (pointer)paVar1;
      value.mData._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_408,"br scan --export 1.json --export 2.json","");
      ot::commissioner::Interpreter::ParseExpression
                ((Expression *)&local_428,&ctx.mInterpreter,(string *)local_408);
      local_448.field_2._M_allocated_capacity = local_468.field_2._M_allocated_capacity;
      local_448._M_string_length = local_468._M_string_length;
      local_448._M_dataplus._M_p = local_468._M_dataplus._M_p;
      local_468.field_2._M_allocated_capacity = local_428.field_2._M_allocated_capacity;
      local_468._M_dataplus._M_p = local_428._M_dataplus._M_p;
      local_468._M_string_length = local_428._M_string_length;
      local_428._M_dataplus._M_p = (pointer)0x0;
      local_428._M_string_length = 0;
      local_428.field_2._M_allocated_capacity = 0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_448);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_428);
      if (local_408 != (undefined1  [8])local_3f8) {
        operator_delete((void *)local_408);
      }
      ot::commissioner::Interpreter::Eval
                ((Value *)local_408,&ctx.mInterpreter,(Expression *)&local_468);
      value.mError.mCode = local_408._0_4_;
      std::__cxx11::string::operator=((string *)&value.mError.mMessage,(string *)&local_400);
      std::__cxx11::string::operator=((string *)&value.mData,(string *)&local_3e0);
      if (local_3e0._M_p != local_3d0) {
        operator_delete(local_3e0._M_p);
      }
      if (local_400._M_p != local_3f0) {
        operator_delete(local_400._M_p);
      }
      bVar5 = ot::commissioner::Interpreter::Value::HasNoError(&value);
      local_448._M_dataplus._M_p._0_1_ = !bVar5;
      local_448._M_string_length = 0;
      if (bVar5) {
        testing::Message::Message((Message *)&local_428);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_408,(internal *)&local_448,(AssertionResult *)0x2ddeee,"true",
                   "false",pcVar6);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_3b0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                   ,0x2f4,(char *)local_408);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_3b0,(Message *)&local_428)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3b0);
        if (local_408 != (undefined1  [8])local_3f8) {
          operator_delete((void *)local_408);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_428._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          (**(code **)(*(size_type *)local_428._M_dataplus._M_p + 8))();
        }
        sVar3 = local_448._M_string_length;
        if ((undefined8 *)local_448._M_string_length != (undefined8 *)0x0) {
          if (*(undefined8 **)local_448._M_string_length !=
              (undefined8 *)(local_448._M_string_length + 0x10)) {
            operator_delete(*(undefined8 **)local_448._M_string_length);
          }
          operator_delete((void *)sVar3);
        }
      }
      ot::commissioner::Interpreter::MultiNetCommandContext::Cleanup((MultiNetCommandContext *)&ctx)
      ;
      ot::commissioner::JobManager::CleanupJobs
                (ctx.mInterpreter.mJobManager.
                 super___shared_ptr<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                );
      local_408 = (undefined1  [8])local_3f8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_408,"opdataset set active --import 1.json --import 2.json","");
      ot::commissioner::Interpreter::ParseExpression
                ((Expression *)&local_428,&ctx.mInterpreter,(string *)local_408);
      local_448.field_2._M_allocated_capacity = local_468.field_2._M_allocated_capacity;
      local_448._M_string_length = local_468._M_string_length;
      local_448._M_dataplus._M_p = local_468._M_dataplus._M_p;
      local_468.field_2._M_allocated_capacity = local_428.field_2._M_allocated_capacity;
      local_468._M_dataplus._M_p = local_428._M_dataplus._M_p;
      local_468._M_string_length = local_428._M_string_length;
      local_428._M_dataplus._M_p = (pointer)0x0;
      local_428._M_string_length = 0;
      local_428.field_2._M_allocated_capacity = 0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_448);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_428);
      if (local_408 != (undefined1  [8])local_3f8) {
        operator_delete((void *)local_408);
      }
      ot::commissioner::Interpreter::Eval
                ((Value *)local_408,&ctx.mInterpreter,(Expression *)&local_468);
      bVar5 = ot::commissioner::Interpreter::Value::HasNoError((Value *)local_408);
      local_448._M_dataplus._M_p._0_1_ = !bVar5;
      local_448._M_string_length = 0;
      if (local_3e0._M_p != local_3d0) {
        operator_delete(local_3e0._M_p);
      }
      if (local_400._M_p != local_3f0) {
        operator_delete(local_400._M_p);
      }
      if ((char)local_448._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_428);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_408,(internal *)&local_448,
                   (AssertionResult *)"ctx.mInterpreter.Eval(expr).HasNoError()","true","false",
                   pcVar6);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_3b0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                   ,0x2f9,(char *)local_408);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_3b0,(Message *)&local_428)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3b0);
        if (local_408 != (undefined1  [8])local_3f8) {
          operator_delete((void *)local_408);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_428._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          (**(code **)(*(size_type *)local_428._M_dataplus._M_p + 8))();
        }
      }
      sVar3 = local_448._M_string_length;
      if ((undefined8 *)local_448._M_string_length != (undefined8 *)0x0) {
        if (*(undefined8 **)local_448._M_string_length !=
            (undefined8 *)(local_448._M_string_length + 0x10)) {
          operator_delete(*(undefined8 **)local_448._M_string_length);
        }
        operator_delete((void *)sVar3);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)value.mData._M_dataplus._M_p != paVar2) {
        operator_delete(value.mData._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)value.mError.mMessage._M_dataplus._M_p != paVar1) {
        operator_delete(value.mError.mMessage._M_dataplus._M_p);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_468);
      goto LAB_00157bc9;
    }
    testing::Message::Message((Message *)&value);
    if (local_3b8 != (undefined8 *)0x0) {
      local_350 = (char *)*local_3b8;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_408,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x2ee,local_350);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_408,(Message *)&value);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_408);
    if ((long *)CONCAT44(value.mError._4_4_,value.mError.mCode) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(value.mError._4_4_,value.mError.mCode) + 8))();
    }
    if (local_3b8 == (undefined8 *)0x0) goto LAB_00157bc9;
    if ((undefined8 *)*local_3b8 != local_3b8 + 2) {
      operator_delete((undefined8 *)*local_3b8);
    }
  }
  operator_delete(local_3b8);
LAB_00157bc9:
  InterpreterTestSuite::TestContext::~TestContext(&ctx);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, IESV_TwoImportExportClausesMustFail)
{
    TestContext ctx;
    InitContext(ctx);
    ASSERT_EQ(
        ctx.mRegistry->Add(BorderAgent{"127.0.0.1", 20001, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                       "net1", 1, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "domain1", 0, 0, "",
                                       0, 0x1F | BorderAgent::kDomainNameBit | BorderAgent::kExtendedPanIdBit}),
        RegistryStatus::kSuccess);
    ASSERT_EQ(
        ctx.mRegistry->Add(BorderAgent{"127.0.0.2", 20001, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                       "net2", 2, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "domain2", 0, 0, "",
                                       0, 0x1F | BorderAgent::kDomainNameBit | BorderAgent::kExtendedPanIdBit}),
        RegistryStatus::kSuccess);

    Interpreter::Expression expr;
    Interpreter::Value      value;
    expr  = ctx.mInterpreter.ParseExpression("br scan --export 1.json --export 2.json");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_FALSE(value.HasNoError());
    ctx.mInterpreter.mContext.Cleanup();
    ctx.mInterpreter.mJobManager->CleanupJobs();

    expr = ctx.mInterpreter.ParseExpression("opdataset set active --import 1.json --import 2.json");
    EXPECT_FALSE(ctx.mInterpreter.Eval(expr).HasNoError());
}